

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O0

void __thiscall Mems::Mems(Mems *this,int width,int height)

{
  ostream *poVar1;
  int height_local;
  int width_local;
  Mems *this_local;
  
  std::vector<Mirror,_std::allocator<Mirror>_>::vector(&this->_mems_mirrors);
  std::vector<Mirror,_std::allocator<Mirror>_>::vector(&this->_mems_mirrors_multi);
  std::vector<Mirror,_std::allocator<Mirror>_>::vector(&this->_mems_mirrors_randomrasterized);
  this->_width = width;
  this->_height = height;
  this->max_sample_dis = 18.0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Mems created with width  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_width);
  poVar1 = std::operator<<(poVar1," and height ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->_height);
  poVar1 = std::operator<<(poVar1,"  . ");
  std::operator<<(poVar1,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

Mems::Mems(int width, int height)
  :_width(width),
  _height(height),
  max_sample_dis(18)
  {
    std::cout << "Mems created with width  " <<_width<<" and height "<<_height<< "  . " <<"\n";
    std::cout <<"\n";

  }